

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::BoolOption::help(BoolOption *this,bool verbose)

{
  size_t sVar1;
  char *pcVar2;
  uint local_18;
  uint32_t i;
  bool verbose_local;
  BoolOption *this_local;
  
  fprintf(_stderr,"  -%s, -no-%s",(this->super_Option).name,(this->super_Option).name);
  local_18 = 0;
  while( true ) {
    sVar1 = strlen((this->super_Option).name);
    if (sVar1 * -2 + 0x20 <= (ulong)local_18) break;
    fprintf(_stderr," ");
    local_18 = local_18 + 1;
  }
  fprintf(_stderr," ");
  pcVar2 = "off";
  if ((this->value & 1U) != 0) {
    pcVar2 = "on";
  }
  fprintf(_stderr,"(default: %s)\n",pcVar2);
  if (verbose) {
    fprintf(_stderr,"\n        %s\n",(this->super_Option).description);
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

virtual void help (bool verbose = false){

        fprintf(stderr, "  -%s, -no-%s", name, name);

        for (uint32_t i = 0; i < 32 - strlen(name)*2; i++)
            fprintf(stderr, " ");

        fprintf(stderr, " ");
        fprintf(stderr, "(default: %s)\n", value ? "on" : "off");
        if (verbose){
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }